

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void gen_spr_power8_dpdes(CPUPPCState_conflict2 *env)

{
  if ((((env->spr_cb[0xb0].name == (char *)0x0) && (env->spr[0xb0] == 0)) &&
      (env->spr_cb[0xb0].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0xb0].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0xb0].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0xb0].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0xb0].name = "DPDES";
    env->spr_cb[0xb0].uea_read = spr_noaccess;
    env->spr_cb[0xb0].uea_write = spr_noaccess;
    env->spr_cb[0xb0].oea_read = spr_read_dpdes;
    env->spr_cb[0xb0].oea_write = spr_noaccess;
    env->spr_cb[0xb0].hea_read = spr_read_dpdes;
    env->spr_cb[0xb0].hea_write = spr_write_dpdes;
    env->spr_cb[0xb0].default_value = 0;
    env->spr[0xb0] = 0;
    return;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",0xb0,0xb0);
  exit(1);
}

Assistant:

static inline void _spr_register(CPUPPCState *env, int num,
                                 const char *name,
                                 void (*uea_read)(DisasContext *ctx,
                                                  int gprn, int sprn),
                                 void (*uea_write)(DisasContext *ctx,
                                                   int sprn, int gprn),
                                 void (*oea_read)(DisasContext *ctx,
                                                  int gprn, int sprn),
                                 void (*oea_write)(DisasContext *ctx,
                                                   int sprn, int gprn),
                                 void (*hea_read)(DisasContext *opaque,
                                                  int gprn, int sprn),
                                 void (*hea_write)(DisasContext *opaque,
                                                   int sprn, int gprn),
#if defined(CONFIG_KVM)
                                 uint64_t one_reg_id,
#endif
                                 target_ulong initial_value)
{
    ppc_spr_t *spr;

    spr = &env->spr_cb[num];
    if (spr->name != NULL || env->spr[num] != 0x00000000 ||
        spr->oea_read != NULL || spr->oea_write != NULL ||
        spr->uea_read != NULL || spr->uea_write != NULL) {
        printf("Error: Trying to register SPR %d (%03x) twice !\n", num, num);
        exit(1);
    }
#if defined(PPC_DEBUG_SPR)
    printf("*** register spr %d (%03x) %s val " TARGET_FMT_lx "\n", num, num,
           name, initial_value);
#endif
    spr->name = name;
    spr->uea_read = uea_read;
    spr->uea_write = uea_write;
    spr->oea_read = oea_read;
    spr->oea_write = oea_write;
    spr->hea_read = hea_read;
    spr->hea_write = hea_write;
#if defined(CONFIG_KVM)
    spr->one_reg_id = one_reg_id,
#endif
    env->spr[num] = spr->default_value = initial_value;
}